

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  long lVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Type in0;
  Vector<float,_3> res;
  Vec4 *local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  float local_a8 [4];
  float local_98 [4];
  float local_88 [4];
  undefined8 local_78;
  float fStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  float fStack_64;
  undefined8 uStack_60;
  float local_58;
  Matrix<float,_3,_3> local_50;
  Matrix<float,_3,_3> local_2c;
  
  puVar2 = &local_78;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x24);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_70 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    fStack_64 = evalCtx->in[1].m_data[2];
    uStack_6c = (undefined4)uVar1;
    uStack_68 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_60 = *(undefined8 *)evalCtx->in[2].m_data;
    local_58 = evalCtx->in[2].m_data[2];
    mat = (Matrix<float,_3,_3> *)0x3;
  }
  else {
    uStack_68 = 0;
    fStack_64 = 0.0;
    uStack_60 = 0;
    local_78 = 0;
    fStack_70 = 0.0;
    uStack_6c = 0;
    local_58 = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x3;
    mat = (Matrix<float,_3,_3> *)0x0;
    do {
      lVar3 = 0;
      puVar7 = puVar2;
      do {
        *(undefined4 *)puVar7 = puVar4[lVar3];
        lVar3 = lVar3 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
      } while (lVar3 != 3);
      mat = (Matrix<float,_3,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 3;
    } while (mat != (Matrix<float,_3,_3> *)0x3);
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,3>
            (&local_2c,(MatrixCaseUtils *)&local_78,mat);
  local_50.m_data.m_data[0].m_data[2] = 0.0;
  local_50.m_data.m_data[0].m_data[0] = 0.0;
  local_50.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    local_50.m_data.m_data[0].m_data[lVar3] =
         local_2c.m_data.m_data[0].m_data[lVar3] + local_2c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar3 = 0;
  do {
    local_98[lVar3] =
         local_50.m_data.m_data[0].m_data[lVar3] + local_2c.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,3>
            (&local_50,(MatrixCaseUtils *)&local_78,mat_00);
  local_b8 = (ulong)local_b8._4_4_ << 0x20;
  local_c0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_c0 + lVar3 * 4) =
         local_50.m_data.m_data[0].m_data[lVar3] + local_50.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  lVar3 = 0;
  do {
    local_a8[lVar3] =
         *(float *)((long)&local_c0 + lVar3 * 4) +
         *(float *)((long)(local_2c.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar3 = 0;
  do {
    local_98[lVar3 + 4] = local_98[lVar3] + local_a8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c0 = &evalCtx->color;
  local_b8 = 0x100000000;
  local_b0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_c0 + lVar3 * 4)] = local_98[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}